

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_function_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,TextureFunctionNameArguments *args)

{
  uint uVar1;
  MSLFormatResolution MVar2;
  SPIRType *pSVar3;
  bool bVar4;
  SPIRVariable *pSVar5;
  MSLConstexprSampler *pMVar6;
  SPIRCombinedImageSampler *pSVar7;
  CompilerError *pCVar8;
  string *this_00;
  uint32_t chain;
  uint32_t id;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string *local_58;
  string local_50;
  
  chain = (args->base).img.id;
  pSVar3 = (args->base).imgtype;
  local_58 = __return_storage_ptr__;
  pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this,chain);
  if (pSVar5 == (SPIRVariable *)0x0) {
    bVar4 = false;
    pMVar6 = (MSLConstexprSampler *)0x0;
  }
  else {
    id = (pSVar5->basevariable).id;
    if (id == 0) {
      id = (pSVar5->super_IVariant).self.id;
    }
    pMVar6 = find_constexpr_sampler(this,id);
    bVar4 = Compiler::has_extended_decoration
                      ((Compiler *)this,(pSVar5->super_IVariant).self.id,
                       SPIRVCrossDecorationDynamicImageSampler);
  }
  if ((((this->msl_options).swizzle_texture_samples == true) &&
      ((args->base).is_gather == true && bVar4 == false)) &&
     ((pMVar6 == (MSLConstexprSampler *)0x0 || (pMVar6->ycbcr_conversion_enable == false)))) {
    add_spv_func_and_recompile(this,(pSVar3->image).depth + SPVFuncImplGatherSwizzle);
    this_00 = local_58;
    pcVar9 = "spvGatherSwizzle";
    if ((pSVar3->image).depth != false) {
      pcVar9 = "spvGatherCompareSwizzle";
    }
    ::std::__cxx11::string::string((string *)local_58,pcVar9,(allocator *)&bStack_78);
  }
  else {
    pSVar7 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>((Compiler *)this,chain);
    this_00 = local_58;
    (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
    local_58->_M_string_length = 0;
    (local_58->field_2)._M_local_buf[0] = '\0';
    if (((pMVar6 == (MSLConstexprSampler *)0x0) || (pMVar6->ycbcr_conversion_enable != true)) ||
       (uVar1 = pMVar6->planes, bVar4 != false || uVar1 < 2)) {
      if (pSVar7 != (SPIRCombinedImageSampler *)0x0) {
        chain = (pSVar7->image).id;
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,chain,true);
      ::std::operator+(&bStack_78,&local_50,".");
      ::std::__cxx11::string::operator=((string *)this_00,(string *)&bStack_78);
      ::std::__cxx11::string::~string((string *)&bStack_78);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::append((char *)this_00);
      if (args->has_dref != true) {
        return this_00;
      }
    }
    else {
      if ((uVar1 & 0xfffffffe) != 2) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&bStack_78,"Unhandled number of color image planes!",
                   (allocator *)&local_50);
        CompilerError::CompilerError(pCVar8,&bStack_78);
        __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((pMVar6->resolution == MSL_FORMAT_RESOLUTION_444) ||
         (pMVar6->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)) {
        add_spv_func_and_recompile(this,uVar1 == 2 ^ SPVFuncImplChromaReconstructNearest3Plane);
        ::std::__cxx11::string::assign((char *)this_00);
        return this_00;
      }
      ::std::__cxx11::string::assign((char *)local_58);
      MVar2 = pMVar6->resolution;
      if (MVar2 == MSL_FORMAT_RESOLUTION_422) {
        if (pMVar6->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          add_spv_func_and_recompile
                    (this,pMVar6->planes == 2 ^ SPVFuncImplChromaReconstructLinear422Midpoint3Plane)
          ;
        }
        else {
          if (pMVar6->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&bStack_78,"Invalid chroma location.",(allocator *)&local_50);
            CompilerError::CompilerError(pCVar8,&bStack_78);
            __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          add_spv_func_and_recompile
                    (this,pMVar6->planes == 2 ^
                          SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
        }
      }
      else {
        if (MVar2 != MSL_FORMAT_RESOLUTION_420) {
          if (MVar2 != MSL_FORMAT_RESOLUTION_444) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&bStack_78,"Invalid format resolution.",(allocator *)&local_50);
            CompilerError::CompilerError(pCVar8,&bStack_78);
            __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1f0b,
                        "virtual string spirv_cross::CompilerMSL::to_function_name(const TextureFunctionNameArguments &)"
                       );
        }
        ::std::__cxx11::string::append((char *)this_00);
        if (pMVar6->x_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
          if (pMVar6->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,pMVar6->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
          }
          else {
            if (pMVar6->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&bStack_78,"Invalid Y chroma location.",(allocator *)&local_50);
              CompilerError::CompilerError(pCVar8,&bStack_78);
              __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,pMVar6->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
          }
        }
        else {
          if (pMVar6->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&bStack_78,"Invalid X chroma location.",(allocator *)&local_50);
            CompilerError::CompilerError(pCVar8,&bStack_78);
            __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (pMVar6->y_chroma_offset == MSL_CHROMA_LOCATION_MIDPOINT) {
            add_spv_func_and_recompile
                      (this,pMVar6->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
          }
          else {
            if (pMVar6->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
              pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&bStack_78,"Invalid Y chroma location.",(allocator *)&local_50);
              CompilerError::CompilerError(pCVar8,&bStack_78);
              __cxa_throw(pCVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            add_spv_func_and_recompile
                      (this,pMVar6->planes == 2 ^
                            SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
          }
        }
      }
    }
    ::std::__cxx11::string::append((char *)this_00);
  }
  return this_00;
}

Assistant:

string CompilerMSL::to_function_name(const TextureFunctionNameArguments &args)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	const MSLConstexprSampler *constexpr_sampler = nullptr;
	bool is_dynamic_img_sampler = false;
	if (auto *var = maybe_get_backing_variable(img))
	{
		constexpr_sampler = find_constexpr_sampler(var->basevariable ? var->basevariable : VariableID(var->self));
		is_dynamic_img_sampler = has_extended_decoration(var->self, SPIRVCrossDecorationDynamicImageSampler);
	}

	// Special-case gather. We have to alter the component being looked up
	// in the swizzle case.
	if (msl_options.swizzle_texture_samples && args.base.is_gather && !is_dynamic_img_sampler &&
	    (!constexpr_sampler || !constexpr_sampler->ycbcr_conversion_enable))
	{
		add_spv_func_and_recompile(imgtype.image.depth ? SPVFuncImplGatherCompareSwizzle : SPVFuncImplGatherSwizzle);
		return imgtype.image.depth ? "spvGatherCompareSwizzle" : "spvGatherSwizzle";
	}

	auto *combined = maybe_get<SPIRCombinedImageSampler>(img);

	// Texture reference
	string fname;
	if (needs_chroma_reconstruction(constexpr_sampler) && !is_dynamic_img_sampler)
	{
		if (constexpr_sampler->planes != 2 && constexpr_sampler->planes != 3)
			SPIRV_CROSS_THROW("Unhandled number of color image planes!");
		// 444 images aren't downsampled, so we don't need to do linear filtering.
		if (constexpr_sampler->resolution == MSL_FORMAT_RESOLUTION_444 ||
		    constexpr_sampler->chroma_filter == MSL_SAMPLER_FILTER_NEAREST)
		{
			if (constexpr_sampler->planes == 2)
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest2Plane);
			else
				add_spv_func_and_recompile(SPVFuncImplChromaReconstructNearest3Plane);
			fname = "spvChromaReconstructNearest";
		}
		else // Linear with a downsampled format
		{
			fname = "spvChromaReconstructLinear";
			switch (constexpr_sampler->resolution)
			{
			case MSL_FORMAT_RESOLUTION_444:
				assert(false);
				break; // not reached
			case MSL_FORMAT_RESOLUTION_422:
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422CositedEven3Plane);
					fname += "422CositedEven";
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					if (constexpr_sampler->planes == 2)
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint2Plane);
					else
						add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear422Midpoint3Plane);
					fname += "422Midpoint";
					break;
				default:
					SPIRV_CROSS_THROW("Invalid chroma location.");
				}
				break;
			case MSL_FORMAT_RESOLUTION_420:
				fname += "420";
				switch (constexpr_sampler->x_chroma_offset)
				{
				case MSL_CHROMA_LOCATION_COSITED_EVEN:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYCositedEven3Plane);
						fname += "XCositedEvenYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XCositedEvenYMidpoint3Plane);
						fname += "XCositedEvenYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				case MSL_CHROMA_LOCATION_MIDPOINT:
					switch (constexpr_sampler->y_chroma_offset)
					{
					case MSL_CHROMA_LOCATION_COSITED_EVEN:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven2Plane);
						else
							add_spv_func_and_recompile(
							    SPVFuncImplChromaReconstructLinear420XMidpointYCositedEven3Plane);
						fname += "XMidpointYCositedEven";
						break;
					case MSL_CHROMA_LOCATION_MIDPOINT:
						if (constexpr_sampler->planes == 2)
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint2Plane);
						else
							add_spv_func_and_recompile(SPVFuncImplChromaReconstructLinear420XMidpointYMidpoint3Plane);
						fname += "XMidpointYMidpoint";
						break;
					default:
						SPIRV_CROSS_THROW("Invalid Y chroma location.");
					}
					break;
				default:
					SPIRV_CROSS_THROW("Invalid X chroma location.");
				}
				break;
			default:
				SPIRV_CROSS_THROW("Invalid format resolution.");
			}
		}
	}
	else
	{
		fname = to_expression(combined ? combined->image : img) + ".";

		// Texture function and sampler
		if (args.base.is_fetch)
			fname += "read";
		else if (args.base.is_gather)
			fname += "gather";
		else
			fname += "sample";

		if (args.has_dref)
			fname += "_compare";
	}

	return fname;
}